

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base.c
# Opt level: O0

base_t * base_new(tsdn_t *tsdn,uint ind,extent_hooks_t *extent_hooks)

{
  _Bool _Var1;
  base_block_t *pbVar2;
  base_t *base_00;
  size_t *in_RDX;
  uint in_ESI;
  undefined8 in_RDI;
  szind_t i;
  base_t *base;
  size_t base_size;
  size_t base_alignment;
  size_t gap_size;
  base_block_t *block;
  size_t extent_sn_next;
  size_t in_stack_00000060;
  pszind_t pind_last;
  size_t size;
  char *name;
  uint in_stack_ffffffffffffff68;
  undefined4 uVar3;
  extent_t *extent;
  size_t in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  uint uVar4;
  size_t *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffffc8;
  extent_hooks_t *in_stack_ffffffffffffffd8;
  base_t *pbVar5;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  tsdn_t *in_stack_ffffffffffffffe8;
  
  size = 0x7f8;
  name = (char *)0x10;
  pbVar2 = base_block_alloc(in_stack_ffffffffffffffe8,
                            (base_t *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
                            in_stack_ffffffffffffffd8,(uint)((ulong)in_RDI >> 0x20),
                            (pszind_t *)CONCAT44(in_ESI,in_stack_ffffffffffffffc8),in_RDX,
                            in_stack_00000060,(size_t)extent_hooks);
  if (pbVar2 == (base_block_t *)0x0) {
    pbVar5 = (base_t *)0x0;
  }
  else {
    pbVar5 = (base_t *)
             base_extent_bump_alloc_helper
                       ((extent_t *)0x800,in_stack_ffffffffffffff88,
                        CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                        in_stack_ffffffffffffff78);
    pbVar5->ind = in_ESI;
    extent = (extent_t *)&pbVar5->extent_hooks;
    base_00 = (base_t *)0x0;
    uVar3 = 0;
    ((atomic_p_t *)extent)->repr = in_RDX;
    _Var1 = malloc_mutex_init((malloc_mutex_t *)(ulong)in_stack_ffffffffffffff68,name,
                              (witness_rank_t)(size >> 0x20),(malloc_mutex_lock_order_t)size);
    if (_Var1) {
      base_unmap((tsdn_t *)CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                 (extent_hooks_t *)base_00,(uint)((ulong)extent >> 0x20),
                 (void *)CONCAT44(uVar3,in_stack_ffffffffffffff68),(size_t)name);
      pbVar5 = (base_t *)0x0;
    }
    else {
      pbVar5->pind_last = 0;
      pbVar5->extent_sn_next = 0;
      pbVar5->blocks = pbVar2;
      pbVar5->auto_thp_switched = false;
      for (uVar4 = 0; uVar4 < 0xe8; uVar4 = uVar4 + 1) {
        extent_heap_new((extent_heap_t *)&UNK_001282dc);
      }
      pbVar5->allocated = 0x90;
      pbVar5->resident = 0x1000;
      pbVar5->mapped = pbVar2->size;
      in_stack_ffffffffffffff68 = in_stack_ffffffffffffff68 & 0xffffff;
      if (opt_metadata_thp == metadata_thp_always) {
        _Var1 = metadata_thp_madvise();
        in_stack_ffffffffffffff68 = CONCAT13(_Var1,(int3)in_stack_ffffffffffffff68);
      }
      pbVar5->n_thp = (ulong)((char)(in_stack_ffffffffffffff68 >> 0x18) != '\0');
      base_extent_bump_alloc_post
                (base_00,extent,CONCAT44(uVar3,in_stack_ffffffffffffff68),name,size);
    }
  }
  return pbVar5;
}

Assistant:

base_t *
base_new(tsdn_t *tsdn, unsigned ind, extent_hooks_t *extent_hooks) {
	pszind_t pind_last = 0;
	size_t extent_sn_next = 0;
	base_block_t *block = base_block_alloc(tsdn, NULL, extent_hooks, ind,
	    &pind_last, &extent_sn_next, sizeof(base_t), QUANTUM);
	if (block == NULL) {
		return NULL;
	}

	size_t gap_size;
	size_t base_alignment = CACHELINE;
	size_t base_size = ALIGNMENT_CEILING(sizeof(base_t), base_alignment);
	base_t *base = (base_t *)base_extent_bump_alloc_helper(&block->extent,
	    &gap_size, base_size, base_alignment);
	base->ind = ind;
	atomic_store_p(&base->extent_hooks, extent_hooks, ATOMIC_RELAXED);
	if (malloc_mutex_init(&base->mtx, "base", WITNESS_RANK_BASE,
	    malloc_mutex_rank_exclusive)) {
		base_unmap(tsdn, extent_hooks, ind, block, block->size);
		return NULL;
	}
	base->pind_last = pind_last;
	base->extent_sn_next = extent_sn_next;
	base->blocks = block;
	base->auto_thp_switched = false;
	for (szind_t i = 0; i < SC_NSIZES; i++) {
		extent_heap_new(&base->avail[i]);
	}
	if (config_stats) {
		base->allocated = sizeof(base_block_t);
		base->resident = PAGE_CEILING(sizeof(base_block_t));
		base->mapped = block->size;
		base->n_thp = (opt_metadata_thp == metadata_thp_always) &&
		    metadata_thp_madvise() ? HUGEPAGE_CEILING(sizeof(base_block_t))
		    >> LG_HUGEPAGE : 0;
		assert(base->allocated <= base->resident);
		assert(base->resident <= base->mapped);
		assert(base->n_thp << LG_HUGEPAGE <= base->mapped);
	}
	base_extent_bump_alloc_post(base, &block->extent, gap_size, base,
	    base_size);

	return base;
}